

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int sendMessage(string *cmd,int socket_fd,string *currUser)

{
  int __fd;
  ostream *this;
  void *__buf;
  ssize_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *currUser_local;
  string *psStack_10;
  int socket_fd_local;
  string *cmd_local;
  
  local_20 = currUser;
  currUser_local._4_4_ = socket_fd;
  psStack_10 = cmd;
  std::operator+(local_60,(char *)currUser);
  std::operator+(local_40,local_60);
  this = std::operator<<((ostream *)&std::cout,(string *)local_40);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  __fd = currUser_local._4_4_;
  std::operator+(local_b0,(char *)local_20);
  std::operator+(local_90,local_b0);
  __buf = (void *)std::__cxx11::string::c_str();
  sVar1 = send(__fd,__buf,0xff,0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  if (sVar1 == -1) {
    perror("send");
  }
  return 1;
}

Assistant:

int sendMessage(string cmd, int socket_fd, const string& currUser){

    cout << currUser + ": " + cmd << endl;
    if(send(socket_fd,(currUser + ": " + cmd).c_str(), MAXDATASIZE -1, 0) == -1)
        perror("send");

    return 1;
}